

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

iterator * __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  byte key_byte;
  value_type vVar1;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  kVar2;
  ulong uVar3;
  undefined8 uVar4;
  value_type vVar5;
  uint uVar6;
  int iVar7;
  node_ptr nVar8;
  stack_entry *psVar9;
  iterator *piVar10;
  void *pvVar11;
  void *__n;
  node_ptr aleaf;
  undefined7 in_register_00000081;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbVar12;
  node_type nVar13;
  find_result fVar14;
  undefined1 local_b0 [8];
  iter_result_opt cnxt;
  undefined1 local_80 [8];
  iter_result_opt nxt;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  local_50;
  key_prefix_snapshot key_prefix;
  node_ptr local_40;
  iterator *local_38;
  
  pvVar11 = search_key.field_0._8_8_;
  invalidate(this);
  *match = false;
  aleaf.tagged_ptr = (this->db_->root).tagged_ptr;
  if (aleaf.tagged_ptr != 0) {
    key_prefix.u64._4_4_ = (undefined4)CONCAT71(in_register_00000081,fwd);
    cnxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._24_8_ = search_key.field_0._0_8_;
    nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._24_8_ = search_key.field_0._0_8_;
    local_38 = this;
    while( true ) {
      this = local_38;
      uVar4 = cnxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
              _24_8_;
      pbVar12 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *)(aleaf.tagged_ptr & 0xfffffffffffffff8);
      nVar13 = (node_type)aleaf.tagged_ptr & (I256|I48);
      if ((aleaf.tagged_ptr & 7) == 0) break;
      kVar2 = pbVar12->k_prefix;
      local_80 = (undefined1  [8])0x0;
      __n = pvVar11;
      if ((void *)0x7 < pvVar11) {
        __n = (void *)0x8;
      }
      local_50 = kVar2;
      local_40.tagged_ptr = aleaf.tagged_ptr;
      memcpy(local_80,(void *)nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                              ._24_8_,(size_t)__n);
      uVar6 = detail::key_prefix_snapshot::get_shared_length
                        ((key_prefix_snapshot *)&local_50.f,(uint64_t)local_80);
      if (uVar6 < kVar2.f.key_prefix_length.value.value) {
        vVar1 = *(value_type *)
                 (nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._24_8_ + (ulong)uVar6);
        vVar5 = detail::key_prefix_snapshot::operator[]
                          ((key_prefix_snapshot *)&local_50.f,(ulong)uVar6);
        if (vVar1 == vVar5) {
          __assert_fail("cmp_ != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x4ce,
                        "typename db<Key, Value>::iterator &unodb::db<std::span<const std::byte>, std::span<const std::byte>>::iterator::seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                       );
        }
        if (key_prefix.f.key_prefix._M_elems[4] != 0) {
          nVar8.tagged_ptr = local_40.tagged_ptr;
          piVar10 = local_38;
          if (vVar1 < vVar5) {
LAB_00123608:
            piVar10 = left_most_traversal(piVar10,(node_ptr)nVar8.tagged_ptr);
            return piVar10;
          }
          this = right_most_traversal(local_38,local_40);
          goto LAB_001234fe;
        }
        nVar8.tagged_ptr = local_40.tagged_ptr;
        piVar10 = local_38;
        if (vVar5 <= vVar1) {
LAB_0012362a:
          piVar10 = right_most_traversal(piVar10,(node_ptr)nVar8.tagged_ptr);
          return piVar10;
        }
        this = left_most_traversal(local_38,local_40);
        goto LAB_001234e8;
      }
      detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                 &nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_engaged,(ulong)kVar2 >> 0x38);
      key_byte = *(byte *)nxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                          ._24_8_;
      fVar14 = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               ::find_child(pbVar12,nVar13,key_byte);
      if (fVar14.second ==
          (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *)
          0x0) {
        if (key_prefix.f.key_prefix._M_elems[4] != 0) {
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::gte_key_byte((iter_result_opt *)local_80,pbVar12,nVar13,key_byte);
          piVar10 = local_38;
          if (nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
              _M_payload._16_1_ == '\0') {
            if ((local_38->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                (local_38->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              pop(local_38);
            }
            while( true ) {
              if ((piVar10->stack_).c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  (piVar10->stack_).c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                return piVar10;
              }
              psVar9 = top(piVar10);
              uVar3 = (psVar9->node).tagged_ptr;
              pbVar12 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                         *)(uVar3 & 0xfffffffffffffff8);
              nVar13 = (node_type)uVar3;
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::next((iter_result_opt *)local_b0,pbVar12,nVar13 & (I256|I48),psVar9->child_index);
              if (cnxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_payload._16_1_ == '\x01') break;
              pop(piVar10);
            }
            nVar8 = detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                    ::get_child(pbVar12,nVar13 & (I256|I48),psVar9->child_index);
          }
          else {
            nVar8 = detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                    ::get_child(pbVar12,nVar13,
                                nxt.
                                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                                ._M_payload._M_value.node.tagged_ptr._1_1_);
            piVar10 = local_38;
            push(local_38,local_40,
                 nxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                 ._M_payload._M_value.node.tagged_ptr._0_1_,
                 nxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                 ._M_payload._M_value.node.tagged_ptr._1_1_,
                 (key_prefix_snapshot)
                 nxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                 ._M_payload._8_8_);
          }
          goto LAB_00123608;
        }
        detail::
        basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        ::lte_key_byte((iter_result_opt *)local_80,pbVar12,nVar13,key_byte);
        piVar10 = local_38;
        if (nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
            _M_payload._16_1_ == '\0') {
          if ((local_38->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              (local_38->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            pop(local_38);
          }
          while( true ) {
            if ((piVar10->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                (piVar10->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              return piVar10;
            }
            psVar9 = top(piVar10);
            uVar3 = (psVar9->node).tagged_ptr;
            pbVar12 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                       *)(uVar3 & 0xfffffffffffffff8);
            nVar13 = (node_type)uVar3;
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            ::prior((iter_result_opt *)local_b0,pbVar12,nVar13 & (I256|I48),psVar9->child_index);
            if (cnxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._M_payload._16_1_ == '\x01') break;
            pop(piVar10);
          }
          nVar8 = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_child(pbVar12,nVar13 & (I256|I48),psVar9->child_index);
        }
        else {
          nVar8 = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_child(pbVar12,nVar13,
                              nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                              ._M_payload._M_value.node.tagged_ptr._1_1_);
          piVar10 = local_38;
          push(local_38,local_40,
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._M_value.node.tagged_ptr._0_1_,
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._M_value.node.tagged_ptr._1_1_,
               (key_prefix_snapshot)
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._8_8_);
        }
        goto LAB_0012362a;
      }
      push(local_38,local_40,key_byte,fVar14.first,(key_prefix_snapshot)local_50);
      aleaf.tagged_ptr = ((fVar14.second)->value).tagged_ptr;
      detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                 &nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_engaged,1);
    }
    push_leaf(local_38,aleaf);
    iVar7 = detail::
            basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
            ::cmp((basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
                   *)pbVar12,(void *)uVar4,pvVar11);
    if (iVar7 == 0) {
      *match = true;
    }
    else if (key_prefix.f.key_prefix._M_elems[4] == 0) {
      if (iVar7 < 1) {
LAB_001234e8:
        this = prior(this);
      }
    }
    else if (-1 < iVar7) {
LAB_001234fe:
      this = next(this);
    }
  }
  return this;
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::seek(
    art_key_type search_key, bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // aka end()

  auto node{db_.root};
  const auto k = search_key;
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      push_leaf(node);
      const auto cmp_ = leaf->cmp(k);
      if (cmp_ == 0) {
        match = true;
        return *this;
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use the leaf, else next().
        return (cmp_ < 0) ? *this : next();
      }
      // LTE semantics: if search_key > leaf, use the leaf, else prior().
      return (cmp_ > 0) ? *this : prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return left_most_traversal(node);
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return right_most_traversal(node).next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return left_most_traversal(node).prior();
      }
      // REV and the search key is ordered after this node.
      return right_most_traversal(node);
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // possible parent from the stack
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(cnode.type(), centry.child_index);
              return left_most_traversal(nchild);
            }
            pop();
          }
          return *this;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child = inode->get_child(node_type, child_index);
        push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
        return left_most_traversal(child);  // left most traversal
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // possible parent from stack
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(cnode.type(), centry.child_index);
            return right_most_traversal(nchild);
          }
          pop();
        }
        return *this;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index{tmp.child_index};
      const auto child = inode->get_child(node_type, child_index);
      push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
      return right_most_traversal(child);  // right most traversal
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    push(node, remaining_key[0], child_index, key_prefix);
    node = *child;
    remaining_key.shift_right(1);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}